

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinstats.cpp
# Opt level: O0

void kernel::ApplyHash<HashWriter>
               (HashWriter *hash_obj,Txid *hash,
               map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
               *outputs)

{
  long lVar1;
  bool bVar2;
  COutPoint *in_RSI;
  long in_FS_OFFSET;
  const_iterator it;
  Coin coin;
  COutPoint outpoint;
  undefined4 in_stack_ffffffffffffff38;
  uint32_t in_stack_ffffffffffffff3c;
  COutPoint *in_stack_ffffffffffffff40;
  COutPoint *in_stack_ffffffffffffff48;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
  ::begin((map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
           *)in_stack_ffffffffffffff40);
  while( true ) {
    std::
    map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
    ::end((map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
           *)in_stack_ffffffffffffff40);
    bVar2 = std::operator==((_Self *)in_stack_ffffffffffffff48,(_Self *)in_stack_ffffffffffffff40);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    in_stack_ffffffffffffff48 = in_RSI;
    std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_Coin>_>::operator->
              ((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_Coin>_> *)
               CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    COutPoint::COutPoint
              (in_stack_ffffffffffffff48,&in_stack_ffffffffffffff40->hash,in_stack_ffffffffffffff3c)
    ;
    std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_Coin>_>::operator->
              ((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_Coin>_> *)
               CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    Coin::Coin((Coin *)in_stack_ffffffffffffff48,(Coin *)in_stack_ffffffffffffff40);
    ApplyCoinHash((HashWriter *)in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                  (Coin *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    Coin::~Coin((Coin *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_Coin>_>::operator++
              ((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_Coin>_> *)
               CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void ApplyHash(T& hash_obj, const Txid& hash, const std::map<uint32_t, Coin>& outputs)
{
    for (auto it = outputs.begin(); it != outputs.end(); ++it) {
        COutPoint outpoint = COutPoint(hash, it->first);
        Coin coin = it->second;
        ApplyCoinHash(hash_obj, outpoint, coin);
    }
}